

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcTestSubcase.hpp
# Opt level: O2

SubcaseBasePtr deqp::TestSubcase::Create<gl4cts::(anonymous_namespace)::BasicAtomicCase3>(void)

{
  SubcaseBase *ptr;
  SharedPtrStateBase *extraout_RDX;
  SharedPtr<deqp::SubcaseBase> *in_RDI;
  SubcaseBasePtr SVar1;
  
  ptr = (SubcaseBase *)operator_new(0x38);
  (ptr->super_GLWrapper)._vptr_GLWrapper = (_func_int **)0x0;
  (ptr->super_GLWrapper).super_CallLogWrapper.m_gl = (Functions *)0x0;
  (ptr->super_GLWrapper).super_CallLogWrapper.m_log = (TestLog *)0x0;
  *(undefined8 *)&(ptr->super_GLWrapper).super_CallLogWrapper.m_enableLog = 0;
  (ptr->super_GLWrapper).m_context = (Context *)0x0;
  ptr[1].super_GLWrapper._vptr_GLWrapper = (_func_int **)0x0;
  ptr[1].super_GLWrapper.super_CallLogWrapper.m_gl = (Functions *)0x0;
  gl4cts::anon_unknown_0::ShaderStorageBufferObjectBase::ShaderStorageBufferObjectBase
            ((ShaderStorageBufferObjectBase *)ptr);
  (ptr->super_GLWrapper)._vptr_GLWrapper = (_func_int **)&PTR__SubcaseBase_01dcf708;
  de::SharedPtr<deqp::SubcaseBase>::SharedPtr(in_RDI,ptr);
  SVar1.m_state = extraout_RDX;
  SVar1.m_ptr = (SubcaseBase *)in_RDI;
  return SVar1;
}

Assistant:

static SubcaseBase::SubcaseBasePtr Create()
	{
		return SubcaseBase::SubcaseBasePtr(new Type());
	}